

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O3

string * __thiscall Image::toString_abi_cxx11_(string *__return_storage_ptr__,Image *this)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  ostream *poVar4;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  uint uVar8;
  ulong uVar9;
  stringstream ss;
  stringstream local_1b8 [16];
  long local_1a8 [2];
  undefined8 auStack_198 [12];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  if (this->height != 0) {
    uVar8 = 0;
    do {
      uVar5 = this->width;
      if (uVar5 != 0) {
        uVar3 = (ulong)this->colors;
        uVar6 = 0;
        do {
          iVar2 = (int)uVar3;
          uVar3 = 0;
          if (iVar2 != 0) {
            uVar9 = 0;
            do {
              *(undefined8 *)((long)auStack_198 + *(long *)(local_1a8[0] + -0x18)) = 3;
              poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
              pcVar7 = ",";
              if (uVar9 == this->colors - 1) {
                pcVar7 = "|";
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,1);
              uVar9 = uVar9 + 1;
              uVar3 = (ulong)this->colors;
            } while (uVar9 < uVar3);
            uVar5 = this->width;
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 < uVar5);
      }
      cVar1 = (char)local_1a8;
      std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      uVar8 = uVar8 + 1;
    } while (uVar8 < this->height);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string Image::toString() {
  std::stringstream ss;
  for (int y = 0; y < height; y++) {
    for (int x = 0; x < width; x++) {
      for (int c = 0; c < colors; c++) {
        ss << std::setw(3) << (unsigned int) pixels[(y * width + x)].colors[c]
           << (c == colors - 1 ? "|" : ",");
      }
    }
    ss << std::endl;
  }
  return ss.str();
}